

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ceiling.cpp
# Opt level: O0

void __thiscall DCeiling::PlayCeilingSound(DCeiling *this)

{
  sector_t_conflict *sec;
  bool bVar1;
  FName local_14;
  DCeiling *local_10;
  DCeiling *this_local;
  
  if ((((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->Flags & 0x40) == 0)
  {
    local_10 = this;
    if (((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->seqType < 0) {
      bVar1 = FName::operator!=(&(((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.
                                  m_Sector)->SeqName).super_FName,NAME_None);
      if (bVar1) {
        sec = (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector;
        FName::FName(&local_14,
                     &(((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)->
                      SeqName).super_FName);
        SN_StartSequence((sector_t *)sec,2,&local_14,0);
      }
      else if (this->m_Silent == 2) {
        SN_StartSequence((sector_t *)
                         (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,2,
                         "Silence",0);
      }
      else if (this->m_Silent == 1) {
        SN_StartSequence((sector_t *)
                         (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,2,
                         "CeilingSemiSilent",0);
      }
      else {
        SN_StartSequence((sector_t *)
                         (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,2,
                         "CeilingNormal",0);
      }
    }
    else {
      SN_StartSequence((sector_t *)
                       (this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector,2,
                       (int)((this->super_DMovingCeiling).super_DMover.super_DSectorEffect.m_Sector)
                            ->seqType,SEQ_PLATFORM,0,false);
    }
  }
  return;
}

Assistant:

void DCeiling::PlayCeilingSound ()
{
	if (m_Sector->Flags & SECF_SILENTMOVE) return;
	if (m_Sector->seqType >= 0)
	{
		SN_StartSequence (m_Sector, CHAN_CEILING, m_Sector->seqType, SEQ_PLATFORM, 0, false);
	}
	else if (m_Sector->SeqName != NAME_None)
	{
		SN_StartSequence (m_Sector, CHAN_CEILING, m_Sector->SeqName, 0);
	}
	else
	{
		if (m_Silent == 2)
			SN_StartSequence (m_Sector, CHAN_CEILING, "Silence", 0);
		else if (m_Silent == 1)
			SN_StartSequence (m_Sector, CHAN_CEILING, "CeilingSemiSilent", 0);
		else
			SN_StartSequence (m_Sector, CHAN_CEILING, "CeilingNormal", 0);
	}
}